

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_BrepFace::InternalFaceBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_BrepFace *this,bool bLazy,
          bool bUpdateCachedBBox)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_BrepFace *pOVar4;
  ON_BrepLoop *this_00;
  ON_3dPoint *pOVar5;
  ON_Geometry *this_01;
  double dVar6;
  ON_Surface *temp_srf;
  double local_a0;
  ON_Interval local_98;
  undefined1 local_80 [8];
  ON_Interval pvdom;
  ON_Interval pudom;
  ON_BrepLoop *loop;
  undefined1 local_50 [4];
  int li;
  ON_BoundingBox pbox;
  ON_Surface *proxy_srf;
  bool bUpdateCachedBBox_local;
  bool bLazy_local;
  ON_BrepFace *this_local;
  undefined4 extraout_var;
  
  if ((bLazy) && (bVar1 = ON_BoundingBox::IsNotEmpty(&this->m_bbox), bVar1)) {
    memcpy(__return_storage_ptr__,&this->m_bbox,0x30);
  }
  else {
    if ((this->m_brep != (ON_Brep *)0x0) &&
       ((((-1 < this->m_face_index &&
          (iVar3 = this->m_face_index,
          iVar2 = ON_ClassArray<ON_BrepFace>::Count
                            ((ON_ClassArray<ON_BrepFace> *)&this->m_brep->m_F), iVar3 < iVar2)) &&
         (pOVar4 = ON_ClassArray<ON_BrepFace>::operator[]
                             ((ON_ClassArray<ON_BrepFace> *)&this->m_brep->m_F,this->m_face_index),
         pOVar4 == this)) &&
        ((pbox.m_max.z = (double)ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy),
         (ON_BrepFace *)pbox.m_max.z != (ON_BrepFace *)0x0 && ((ON_BrepFace *)pbox.m_max.z != this))
        )))) {
      memcpy(local_50,&ON_BoundingBox::NanBoundingBox,0x30);
      for (loop._4_4_ = 0; iVar3 = LoopCount(this), loop._4_4_ < iVar3; loop._4_4_ = loop._4_4_ + 1)
      {
        this_00 = Loop(this,loop._4_4_);
        if ((this_00 != (ON_BrepLoop *)0x0) && (this_00->m_type == outer)) {
          (*(this->m_brep->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])
                    (this->m_brep,this_00,1);
          bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_50);
          bVar1 = ON_Geometry::GetBoundingBox
                            (&this_00->super_ON_Geometry,(ON_BoundingBox *)local_50,bVar1);
          if (!bVar1) {
            memcpy(local_50,&ON_BoundingBox::UnsetBoundingBox,0x30);
          }
          break;
        }
      }
      memcpy(__return_storage_ptr__,&ON_BoundingBox::NanBoundingBox,0x30);
      bVar1 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)local_50);
      if (bVar1) {
        pOVar5 = ON_BoundingBox::operator[]((ON_BoundingBox *)local_50,0);
        dVar6 = pOVar5->x;
        pOVar5 = ON_BoundingBox::operator[]((ON_BoundingBox *)local_50,1);
        ON_Interval::ON_Interval((ON_Interval *)(pvdom.m_t + 1),dVar6,pOVar5->x);
        pOVar5 = ON_BoundingBox::operator[]((ON_BoundingBox *)local_50,0);
        dVar6 = pOVar5->y;
        pOVar5 = ON_BoundingBox::operator[]((ON_BoundingBox *)local_50,1);
        ON_Interval::ON_Interval((ON_Interval *)local_80,dVar6,pOVar5->y);
        dVar6 = ON_Interval::Length((ON_Interval *)(pvdom.m_t + 1));
        ON_Interval::Expand((ON_Interval *)(pvdom.m_t + 1),dVar6 * 0.1);
        dVar6 = ON_Interval::Length((ON_Interval *)local_80);
        ON_Interval::Expand((ON_Interval *)local_80,dVar6 * 0.1);
        (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(this,0);
        local_a0 = dVar6;
        (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(this,1);
        local_98.m_t[1] = dVar6;
        ON_Interval::Intersection((ON_Interval *)(pvdom.m_t + 1),(ON_Interval *)&temp_srf);
        ON_Interval::Intersection((ON_Interval *)local_80,&local_98);
        bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_50);
        if ((bVar1) &&
           ((bVar1 = ON_Interval::Includes
                               ((ON_Interval *)&temp_srf,(ON_Interval *)(pvdom.m_t + 1),true), bVar1
            || (bVar1 = ON_Interval::Includes(&local_98,(ON_Interval *)local_80,true), bVar1)))) {
          iVar3 = (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object
                    ._vptr_ON_Object[0x24])();
          this_01 = (ON_Geometry *)CONCAT44(extraout_var,iVar3);
          if (this_01 != (ON_Geometry *)0x0) {
            bVar1 = ON_Interval::Includes
                              ((ON_Interval *)&temp_srf,(ON_Interval *)(pvdom.m_t + 1),true);
            if (bVar1) {
              (*(this_01->super_ON_Object)._vptr_ON_Object[0x39])(this_01,0,pvdom.m_t + 1);
            }
            bVar1 = ON_Interval::Includes(&local_98,(ON_Interval *)local_80,true);
            if (bVar1) {
              (*(this_01->super_ON_Object)._vptr_ON_Object[0x39])(this_01,1,local_80);
            }
            bVar1 = ON_Geometry::GetBoundingBox(this_01,__return_storage_ptr__,false);
            if (!bVar1) {
              memcpy(__return_storage_ptr__,&ON_BoundingBox::NanBoundingBox,0x30);
            }
            if (this_01 != (ON_Geometry *)0x0) {
              (*(this_01->super_ON_Object)._vptr_ON_Object[4])();
            }
          }
        }
      }
      bVar1 = ON_BoundingBox::IsNotEmpty(__return_storage_ptr__);
      if ((bVar1) ||
         ((bVar1 = ON_Geometry::GetBoundingBox
                             ((ON_Geometry *)pbox.m_max.z,__return_storage_ptr__,false), bVar1 &&
          (bVar1 = ON_BoundingBox::IsNotEmpty(__return_storage_ptr__), bVar1)))) {
        if (!bUpdateCachedBBox) {
          return __return_storage_ptr__;
        }
        memcpy(&this->m_bbox,__return_storage_ptr__,0x30);
        return __return_storage_ptr__;
      }
    }
    memcpy(__return_storage_ptr__,&ON_BoundingBox::EmptyBoundingBox,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_BrepFace::InternalFaceBoundingBox(bool bLazy, bool bUpdateCachedBBox) const
{
  if (bLazy && m_bbox.IsNotEmpty())
    return m_bbox;

  for (;;)
  {
    // Make sure this face is valid enough to query the trims and proxy surface
    if (nullptr == m_brep)
      break;
    if (m_face_index < 0)
      break;
    if (m_face_index >= m_brep->m_F.Count())
      break;
    if (&m_brep->m_F[m_face_index] != this)
      break;

    const ON_Surface* proxy_srf = ProxySurface();
    if (nullptr == proxy_srf)
      break;
    if (proxy_srf == this)
      break;

    ON_BoundingBox pbox = ON_BoundingBox::NanBoundingBox;
    for (int li = 0; li < LoopCount(); li++)
    {
      ON_BrepLoop* loop = Loop(li);
      if (loop && loop->m_type == ON_BrepLoop::outer)
      {
        m_brep->SetTrimBoundingBoxes(*loop, true);       // sets loop->m_pbox 
        if (false == loop->GetBoundingBox(pbox, pbox.IsValid()))
          pbox = ON_BoundingBox::UnsetBoundingBox;
        break;
      }
    }


    ON_BoundingBox face_bbox = ON_BoundingBox::NanBoundingBox;
    if (pbox.IsNotEmpty())
    {
      ON_Interval pudom(pbox[0].x, pbox[1].x);
      ON_Interval pvdom(pbox[0].y, pbox[1].y);
      // fatten up invervals to get slightly larger boxes...
      pudom.Expand(0.1 * pudom.Length());
      pvdom.Expand(0.1 * pvdom.Length());
      ON_Interval Sdom[] = { Domain(0), Domain(1) };
      // but don't let the fattened intervals extend beyond Sdom
      pudom.Intersection(Sdom[0]);
      pvdom.Intersection(Sdom[1]);
      if (pbox.IsValid() &&
        (Sdom[0].Includes(pudom, true) || Sdom[1].Includes(pvdom, true))
        )
      {
        ON_Surface* temp_srf = DuplicateSurface();
        if (nullptr != temp_srf)
        {
          if (Sdom[0].Includes(pudom, true))
            temp_srf->Trim(0, pudom);
          if (Sdom[1].Includes(pvdom, true))
            temp_srf->Trim(1, pvdom);
          if (false == temp_srf->GetBoundingBox(face_bbox, false))
            face_bbox = ON_BoundingBox::NanBoundingBox;
          delete temp_srf;
          temp_srf = nullptr;
        }
      }
    }

    if (false == face_bbox.IsNotEmpty())
    {
      if (false == proxy_srf->GetBoundingBox(face_bbox, false))
        break;
      if (false == face_bbox.IsNotEmpty())
        break;
    }

    if (bUpdateCachedBBox)
      const_cast<ON_BrepFace*>(this)->m_bbox = face_bbox;
    return face_bbox;
  }

  // ON_Brep code has always used ON_BoundingBox::EmptyBoundingBox 
  // to indicate a bounding box is not set. If it were to be written
  // in modern times, it would have used Nans.
  return ON_BoundingBox::EmptyBoundingBox;
}